

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O2

void __thiscall
VW::config::option_group_definition::~option_group_definition(option_group_definition *this)

{
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&this->m_options);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

option_group_definition(std::string name) : m_name(name) {}